

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

uint32_t countDigits(uint64_t v)

{
  uint32_t local_1c;
  uint64_t uStack_18;
  uint32_t result;
  uint64_t v_local;
  
  local_1c = 1;
  uStack_18 = v;
  while( true ) {
    if (uStack_18 < 10) {
      return local_1c;
    }
    if (uStack_18 < 100) {
      return local_1c + 1;
    }
    if (uStack_18 < 1000) {
      return local_1c + 2;
    }
    if (uStack_18 < 10000) break;
    uStack_18 = uStack_18 / 10000;
    local_1c = local_1c + 4;
  }
  return local_1c + 3;
}

Assistant:

static uint32_t countDigits(uint64_t v) {
  uint32_t result = 1;
  for (;;) {
    if (v < 10) return result;
    if (v < 100) return result + 1;
    if (v < 1000) return result + 2;
    if (v < 10000) return result + 3;
    v /= 10000U;
    result += 4;
  }
}